

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddSerialArena
          (ThreadSafeArena *this,void *id,SerialArena *serial)

{
  MutexLock MVar1;
  bool bVar2;
  uint32_t prev_capacity;
  __pointer_type this_00;
  SerialArenaChunk *this_01;
  SerialArenaChunk *new_head;
  MutexLock lock;
  SerialArenaChunk *head;
  SerialArena *serial_local;
  void *id_local;
  ThreadSafeArena *this_local;
  
  lock.mu_ = (Mutex *)std::atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*>::
                      load(&this->head_,memory_order_acquire);
  bVar2 = SerialArenaChunk::IsSentry((SerialArenaChunk *)lock.mu_);
  if ((bVar2) || (bVar2 = SerialArenaChunk::insert((SerialArenaChunk *)lock.mu_,id,serial), !bVar2))
  {
    absl::lts_20240722::MutexLock::MutexLock((MutexLock *)&new_head,&this->mutex_);
    this_00 = std::atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*>::load
                        (&this->head_,memory_order_acquire);
    MVar1 = lock;
    if ((this_00 == (__pointer_type)lock.mu_) ||
       (bVar2 = SerialArenaChunk::insert(this_00,id,serial), MVar1.mu_ = (Mutex *)this_00, !bVar2))
    {
      lock.mu_ = MVar1.mu_;
      prev_capacity = SerialArenaChunk::capacity((SerialArenaChunk *)lock.mu_);
      this_01 = NewSerialArenaChunk(prev_capacity,id,serial);
      SerialArenaChunk::set_next(this_01,(SerialArenaChunk *)lock.mu_);
      std::atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*>::store
                (&this->head_,this_01,memory_order_release);
    }
    absl::lts_20240722::MutexLock::~MutexLock((MutexLock *)&new_head);
  }
  return;
}

Assistant:

void ThreadSafeArena::AddSerialArena(void* id, SerialArena* serial) {
  SerialArenaChunk* head = head_.load(std::memory_order_acquire);
  // Fast path without acquiring mutex.
  if (!head->IsSentry() && head->insert(id, serial)) {
    return;
  }

  // Slow path with acquiring mutex.
  absl::MutexLock lock(&mutex_);

  // Refetch and if someone else installed a new head, try allocating on that!
  SerialArenaChunk* new_head = head_.load(std::memory_order_acquire);
  if (new_head != head) {
    if (new_head->insert(id, serial)) return;
    // Update head to link to the latest one.
    head = new_head;
  }

  new_head = NewSerialArenaChunk(head->capacity(), id, serial);
  new_head->set_next(head);

  // Use "std::memory_order_release" to make sure prior stores are visible after
  // this one.
  head_.store(new_head, std::memory_order_release);
}